

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O0

void gimage::anon_unknown_6::readRow<unsigned_short>
               (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *ret,uint32_t k,
               TiffImage<unsigned_short> *tif,uint32_t row,uint16_t d)

{
  size_type in_RDX;
  uint in_ESI;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RDI;
  ushort in_R8W;
  uint16_t d_1;
  uint32_t i;
  unsigned_short *p;
  undefined2 in_stack_00000018;
  undefined4 in_stack_00000028;
  uint16_t in_stack_0000022a;
  uint32_t in_stack_0000022c;
  TiffImage<unsigned_short> *in_stack_00000230;
  uint32_t in_stack_0000023c;
  unsigned_short *in_stack_00000240;
  ushort local_2e;
  uint local_2c;
  store_t_conflict1 *local_28;
  undefined4 in_stack_fffffffffffffff0;
  
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
            (ret,CONCAT44(k,in_stack_00000028),(long)tif,CONCAT44(row,CONCAT22(d,in_stack_00000018))
            );
  if (((*(byte *)(in_RDX + 0x15) & 1) == 0) && (*(short *)(in_RDX + 0x10) != 1)) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x195292);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDX + 0x60));
    readUnpacked<unsigned_short>
              (in_stack_00000240,in_stack_0000023c,in_stack_00000230,in_stack_0000022c,
               in_stack_0000022a);
    local_28 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1952c9);
    for (local_2c = 0; local_2c < *(uint *)(in_RDX + 8); local_2c = local_2c + 1) {
      for (local_2e = 0; local_2e < *(ushort *)(in_RDX + 0x10); local_2e = local_2e + 1) {
        Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::set
                  (in_RDI,(ulong)local_2c,(ulong)in_ESI,(uint)local_2e,*local_28);
        local_28 = local_28 + 1;
      }
    }
  }
  else {
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getPtr
              (in_RDI,0,(ulong)in_ESI,(uint)in_R8W);
    readUnpacked<unsigned_short>
              (in_stack_00000240,in_stack_0000023c,in_stack_00000230,in_stack_0000022c,
               in_stack_0000022a);
  }
  return;
}

Assistant:

void readRow(gimage::Image<T> &ret, uint32_t k, TiffImage<T> &tif, uint32_t row,
  uint16_t d)
{
  ret.setSize(tif.width, tif.height, tif.depth);

  if (tif.is_planar || tif.depth == 1)
  {
    readUnpacked(ret.getPtr(0, k, d), tif.width, tif, row, d);
  }
  else
  {
    tif.row.resize(tif.width*tif.depth);
    readUnpacked(tif.row.data(), static_cast<uint32_t>(tif.row.size()), tif, row, 0);

    T *p=tif.row.data();
    for (uint32_t i=0; i<tif.width; i++)
    {
      for (uint16_t d=0; d<tif.depth; d++)
      {
        ret.set(i, k, d, *p++);
      }
    }
  }
}